

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void Inline::TraceInlining
               (FunctionJITTimeInfo *inliner,char16 *inlineeName,
               char16 *inlineeFunctionIdandNumberString,uint inlineeByteCodeCount,
               FunctionJITTimeInfo *topFunc,uint inlinedByteCodeCount,FunctionJITTimeInfo *inlinee,
               uint callSiteId,bool inLoopBody,uint builtIn)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  char16_t *pcVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  JITTimeFunctionBody *pJVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  undefined8 in_stack_fffffffffffffd58;
  undefined4 uVar17;
  undefined8 uVar16;
  undefined8 in_stack_fffffffffffffd68;
  undefined4 uVar18;
  undefined8 in_stack_fffffffffffffd78;
  undefined4 uVar20;
  undefined8 uVar19;
  char16 local_178 [2];
  int len;
  char16 debugStringBuffer3 [42];
  wchar local_118 [4];
  char16 debugStringBuffer2 [42];
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  bool inLoopBody_local;
  uint inlinedByteCodeCount_local;
  FunctionJITTimeInfo *topFunc_local;
  uint inlineeByteCodeCount_local;
  char16 *inlineeFunctionIdandNumberString_local;
  char16 *inlineeName_local;
  FunctionJITTimeInfo *inliner_local;
  
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  inlineeFunctionIdandNumberString_local = inlineeName;
  if (inlineeName == (char16 *)0x0) {
    iVar3 = swprintf_s((char16_t_conflict *)local_178,0x2a,(char16_t_conflict *)L"built In Id: %u",
                       (ulong)builtIn);
    if (iVar3 < 0xf) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x176d,"(len > 14)","len > 14");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    inlineeFunctionIdandNumberString_local = local_178;
  }
  uVar4 = FunctionJITTimeInfo::GetSourceContextId(topFunc);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlinePhase,uVar4,uVar5);
  if (bVar2) {
    pcVar8 = L"";
    if (inLoopBody) {
      pcVar8 = L"IN LOOP BODY";
    }
    pJVar11 = FunctionJITTimeInfo::GetBody(inliner);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inliner,(wchar (*) [42])local_b8);
    pJVar11 = FunctionJITTimeInfo::GetBody(inliner);
    uVar4 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
    pJVar11 = FunctionJITTimeInfo::GetBody(topFunc);
    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(topFunc,(wchar (*) [42])local_118);
    pJVar11 = FunctionJITTimeInfo::GetBody(topFunc);
    uVar5 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
    uVar16 = CONCAT44(uVar18,inlinedByteCodeCount);
    Output::Print(L"INLINING %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"
                  ,pcVar8,inlineeFunctionIdandNumberString_local,inlineeFunctionIdandNumberString,
                  (ulong)inlineeByteCodeCount,pcVar9,pcVar10,uVar4,uVar16,pcVar12,pcVar13,uVar5,
                  callSiteId);
    uVar20 = (undefined4)((ulong)pcVar13 >> 0x20);
    uVar17 = (undefined4)((ulong)pcVar10 >> 0x20);
    uVar18 = (undefined4)((ulong)uVar16 >> 0x20);
  }
  uVar4 = FunctionJITTimeInfo::GetSourceContextId(topFunc);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar4,uVar5);
  if (bVar2) {
    pcVar8 = L"";
    if (inLoopBody) {
      pcVar8 = L"IN LOOP BODY";
    }
    pJVar11 = FunctionJITTimeInfo::GetBody(inliner);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inliner,(wchar (*) [42])local_b8);
    pJVar11 = FunctionJITTimeInfo::GetBody(inliner);
    uVar4 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
    pJVar11 = FunctionJITTimeInfo::GetBody(topFunc);
    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(topFunc,(wchar (*) [42])local_118);
    pJVar11 = FunctionJITTimeInfo::GetBody(topFunc);
    uVar5 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
    Output::Print(L"INLINING %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"
                  ,pcVar8,inlineeFunctionIdandNumberString_local,inlineeFunctionIdandNumberString,
                  (ulong)inlineeByteCodeCount,pcVar9,pcVar10,uVar4,
                  CONCAT44(uVar18,inlinedByteCodeCount),pcVar12,pcVar13,uVar5,callSiteId);
    uVar20 = (undefined4)((ulong)pcVar13 >> 0x20);
    uVar17 = (undefined4)((ulong)pcVar10 >> 0x20);
    Output::Flush();
  }
  if (builtIn == 0xffffffff) {
    if ((inliner == (FunctionJITTimeInfo *)0x0) || (inlinee == (FunctionJITTimeInfo *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x1780,"(inliner && inlinee)","inliner && inlinee");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    uVar4 = FunctionJITTimeInfo::GetSourceContextId(inliner);
    uVar5 = FunctionJITTimeInfo::GetSourceContextId(inlinee);
    if (uVar4 != uVar5) {
      uVar4 = FunctionJITTimeInfo::GetSourceContextId(topFunc);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlinePhase,uVar4,uVar5);
      if (bVar2) {
        pcVar9 = FunctionJITTimeInfo::GetDisplayName(inlinee);
        pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inlinee,(wchar (*) [42])local_b8);
        pJVar11 = FunctionJITTimeInfo::GetBody(inlinee);
        uVar4 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
        pcVar12 = FunctionJITTimeInfo::GetDisplayName(inliner);
        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(inliner,(wchar (*) [42])local_118);
        pJVar11 = FunctionJITTimeInfo::GetBody(inliner);
        uVar5 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
        pJVar11 = FunctionJITTimeInfo::GetBody(topFunc);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
        pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(topFunc,(wchar (*) [42])local_178);
        pJVar11 = FunctionJITTimeInfo::GetBody(topFunc);
        uVar6 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
        uVar16 = CONCAT44(uVar17,uVar5);
        uVar19 = CONCAT44(uVar20,uVar6);
        Output::Print(L"INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"
                      ,pcVar9,pcVar10,(ulong)uVar4,pcVar12,pcVar13,uVar16,inlinedByteCodeCount,
                      pcVar14,pcVar15,uVar19);
        uVar20 = (undefined4)((ulong)uVar19 >> 0x20);
        uVar17 = (undefined4)((ulong)uVar16 >> 0x20);
      }
      uVar4 = FunctionJITTimeInfo::GetSourceContextId(topFunc);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar4,uVar5);
      if (bVar2) {
        pcVar9 = FunctionJITTimeInfo::GetDisplayName(inlinee);
        pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inlinee,(wchar (*) [42])local_b8);
        pJVar11 = FunctionJITTimeInfo::GetBody(inlinee);
        uVar4 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
        pcVar12 = FunctionJITTimeInfo::GetDisplayName(inliner);
        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(inliner,(wchar (*) [42])local_118);
        pJVar11 = FunctionJITTimeInfo::GetBody(inliner);
        uVar5 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
        pJVar11 = FunctionJITTimeInfo::GetBody(topFunc);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
        pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(topFunc,(wchar (*) [42])local_178);
        pJVar11 = FunctionJITTimeInfo::GetBody(topFunc);
        uVar6 = JITTimeFunctionBody::GetByteCodeCount(pJVar11);
        Output::Print(L"INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"
                      ,pcVar9,pcVar10,(ulong)uVar4,pcVar12,pcVar13,CONCAT44(uVar17,uVar5),
                      inlinedByteCodeCount,pcVar14,pcVar15,CONCAT44(uVar20,uVar6));
        Output::Flush();
      }
    }
  }
  return;
}

Assistant:

void Inline::TraceInlining(const FunctionJITTimeInfo *const inliner, const char16* inlineeName, const char16* inlineeFunctionIdandNumberString, uint inlineeByteCodeCount,
    const FunctionJITTimeInfo* topFunc, uint inlinedByteCodeCount, const FunctionJITTimeInfo *const inlinee, uint callSiteId, bool inLoopBody, uint builtIn)
{
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    if (inlineeName == nullptr)
    {

        int len = swprintf_s(debugStringBuffer3, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u("built In Id: %u"), builtIn);
        Assert(len > 14);
        inlineeName = debugStringBuffer3;
    }
    INLINE_TRACE_AND_TESTTRACE(_u("INLINING %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"),
        inLoopBody ? _u("IN LOOP BODY") : _u(""),
        inlineeName, inlineeFunctionIdandNumberString, inlineeByteCodeCount,
        inliner->GetBody()->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer), inliner->GetBody()->GetByteCodeCount(), inlinedByteCodeCount,
        topFunc->GetBody()->GetDisplayName(),
        topFunc->GetDebugNumberSet(debugStringBuffer2), topFunc->GetBody()->GetByteCodeCount(),
        callSiteId
    );

    // Now Trace inlining across files cases

    if (builtIn != -1)  // built-in functions
    {
        return;
    }

    Assert(inliner && inlinee);

    if (inliner->GetSourceContextId() != inlinee->GetSourceContextId())
    {
        INLINE_TRACE_AND_TESTTRACE(_u("INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetBody()->GetByteCodeCount(),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2), inliner->GetBody()->GetByteCodeCount(), inlinedByteCodeCount,
            topFunc->GetBody()->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3), topFunc->GetBody()->GetByteCodeCount()
        );
    }

}